

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::cleanUpPowersOfOne(string *unit_string)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char local_21;
  size_t sStack_20;
  value_type ch;
  size_t eraseCnt;
  size_type fndP;
  string *unit_string_local;
  
  eraseCnt = std::__cxx11::string::find((char *)unit_string,0x1ed8f7);
  while (eraseCnt != 0xffffffffffffffff) {
    sStack_20 = 4;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
    local_21 = *pcVar2;
    if ((local_21 == '+') || (local_21 == '-')) {
      sStack_20 = 5;
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= eraseCnt + 5) {
        multiplyRep(unit_string,eraseCnt,5);
        break;
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      local_21 = *pcVar2;
    }
    while (bVar1 = isDigitCharacter(local_21), bVar1) {
      sStack_20 = sStack_20 + 1;
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= eraseCnt + sStack_20) break;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      local_21 = *pcVar2;
    }
    multiplyRep(unit_string,eraseCnt,sStack_20);
    eraseCnt = std::__cxx11::string::find((char *)unit_string,0x1ed8f7);
  }
  eraseCnt = std::__cxx11::string::find((char *)unit_string,0x1ed8fc);
  do {
    while( true ) {
      if (eraseCnt == 0xffffffffffffffff) {
        eraseCnt = std::__cxx11::string::find((char *)unit_string,0x1ed8ff);
        while (eraseCnt != 0xffffffffffffffff) {
          multiplyRep(unit_string,eraseCnt,4);
          eraseCnt = std::__cxx11::string::find((char *)unit_string,0x1ed8ff);
        }
        return;
      }
      uVar3 = std::__cxx11::string::size();
      if (eraseCnt + 2 < uVar3) break;
      std::__cxx11::string::erase((ulong)unit_string,eraseCnt);
LAB_001c45d4:
      eraseCnt = std::__cxx11::string::find((char *)unit_string,0x1ed8fc);
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
    bVar1 = isDigitCharacter(*pcVar2);
    if (!bVar1) {
      std::__cxx11::string::erase((ulong)unit_string,eraseCnt);
      goto LAB_001c45d4;
    }
    eraseCnt = std::__cxx11::string::find((char *)unit_string,0x1ed8fc);
  } while( true );
}

Assistant:

static void cleanUpPowersOfOne(std::string& unit_string)
{  // get rid of (1)^ sequences
    auto fndP = unit_string.find("(1)^");
    while (fndP != std::string::npos) {
        // string cannot end in '^' from a previous check
        size_t eraseCnt = 4;
        auto ch = unit_string[fndP + 4];
        if (ch == '+' || ch == '-') {
            ++eraseCnt;
            if (unit_string.size() <= fndP + eraseCnt) {
                multiplyRep(unit_string, fndP, eraseCnt);
                break;
            }
            ch = unit_string[fndP + eraseCnt];
        }
        while (isDigitCharacter(ch)) {
            ++eraseCnt;
            if (unit_string.size() <= fndP + eraseCnt) {
                break;
            }
            ch = unit_string[fndP + eraseCnt];
        }
        multiplyRep(unit_string, fndP, eraseCnt);
        fndP = unit_string.find("(1)^", fndP);
    }
    // get rid of ^1 sequences
    fndP = unit_string.find("^1");
    while (fndP != std::string::npos) {
        if (unit_string.size() > fndP + 2) {
            if (!isDigitCharacter(unit_string[fndP + 2])) {
                unit_string.erase(fndP, 2);
            } else {
                fndP = unit_string.find("^1", fndP + 2);
                continue;
            }
        } else {
            unit_string.erase(fndP, 2);
        }
        fndP = unit_string.find("^1", fndP);
    }
    // get rid of ^1 sequences
    fndP = unit_string.find("^(1)");
    while (fndP != std::string::npos) {
        multiplyRep(unit_string, fndP, 4);
        fndP = unit_string.find("^(1)", fndP);
    }
}